

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)0,std::__cxx11::string>
          (MessageLite *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  MessageLite *in_RCX;
  StringPiece input_00;
  
  input_00.length_ = (stringpiece_ssize_type)this;
  input_00.ptr_ = (char *)input->_M_string_length;
  bVar1 = internal::MergePartialFromImpl<false>
                    ((internal *)(input->_M_dataplus)._M_p,input_00,in_RCX);
  if (bVar1) {
    iVar3 = (*this->_vptr_MessageLite[8])(this);
    cVar2 = (char)iVar3;
    if (cVar2 == '\0') {
      LogInitializationErrorMessage(this);
    }
  }
  else {
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = flags & kMergeWithAliasing;
  bool res = internal::MergePartialFromImpl<alias>(input, this);
  return res && ((flags & kMergePartial) || IsInitializedWithErrors());
}